

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int64_t GmfOpenMesh(char *FilNam,int mod,...)

{
  uint *puVar1;
  uint *puVar2;
  char in_AL;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  FILE *pFVar7;
  uint *in_RCX;
  uint *in_RDX;
  uint in_ESI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  GmfMshSct *msh;
  va_list VarArg;
  char str [1024];
  int64_t MshIdx;
  int err;
  int *PtrDim;
  int *PtrVer;
  int res;
  int KwdCod;
  void *in_stack_fffffffffffffa78;
  uint **wrd;
  GmfMshSct *in_stack_fffffffffffffa80;
  GmfMshSct *msh_00;
  undefined1 local_528 [16];
  uint *local_518;
  uint *local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 local_4e8;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  uint *local_470;
  undefined1 local_468 [16];
  undefined1 *local_458;
  char local_448 [32];
  GmfMshSct *in_stack_fffffffffffffea0;
  int local_18;
  uint *local_8;
  
  if (in_AL != '\0') {
    local_4f8 = in_XMM0_Qa;
    local_4e8 = in_XMM1_Qa;
    local_4d8 = in_XMM2_Qa;
    local_4c8 = in_XMM3_Qa;
    local_4b8 = in_XMM4_Qa;
    local_4a8 = in_XMM5_Qa;
    local_498 = in_XMM6_Qa;
    local_488 = in_XMM7_Qa;
  }
  local_518 = in_RDX;
  local_510 = in_RCX;
  local_508 = in_R8;
  local_500 = in_R9;
  local_8 = (uint *)calloc(1,0x303710);
  if (local_8 == (uint *)0x0) {
    local_8 = (uint *)0x0;
  }
  else {
    local_470 = local_8;
    iVar3 = _setjmp((__jmp_buf_tag *)(local_8 + 0x12));
    if (iVar3 == 0) {
      sVar5 = strlen(in_RDI);
      if (0x3ff < sVar5 + 7) {
        longjmp((__jmp_buf_tag *)(local_470 + 0x12),-4);
      }
      strcpy((char *)(local_470 + 0xc010c),in_RDI);
      local_470[2] = in_ESI;
      *(uint **)(local_470 + 0xc010a) = local_470 + 0xc020c;
      *(uint **)(local_470 + 0xc0108) = local_470 + 0xc020c;
      *(uint **)(local_470 + 0xc0106) = local_470 + 0xc020c;
      pcVar6 = strstr((char *)(local_470 + 0xc010c),".meshb");
      if (pcVar6 == (char *)0x0) {
        pcVar6 = strstr((char *)(local_470 + 0xc010c),".mesh");
        if (pcVar6 == (char *)0x0) {
          pcVar6 = strstr((char *)(local_470 + 0xc010c),".solb");
          if (pcVar6 == (char *)0x0) {
            pcVar6 = strstr((char *)(local_470 + 0xc010c),".sol");
            if (pcVar6 == (char *)0x0) {
              longjmp((__jmp_buf_tag *)(local_470 + 0x12),-5);
            }
            local_470[3] = local_470[3] | 9;
          }
          else {
            local_470[3] = local_470[3] | 10;
          }
        }
        else {
          local_470[3] = local_470[3] | 5;
        }
      }
      else {
        local_470[3] = local_470[3] | 6;
      }
      puVar2 = local_510;
      puVar1 = local_518;
      if (local_470[2] == 1) {
        local_458 = local_528;
        local_468._8_8_ = &stack0x00000008;
        local_468._4_4_ = 0x30;
        local_468._0_4_ = 0x20;
        if ((local_470[3] & 2) == 0) {
          pFVar7 = fopen((char *)(local_470 + 0xc010c),"rb");
          *(FILE **)(local_470 + 0xc0104) = pFVar7;
          if (pFVar7 == (FILE *)0x0) {
            longjmp((__jmp_buf_tag *)(local_470 + 0x12),-0xd);
          }
          do {
            iVar3 = __isoc99_fscanf(*(undefined8 *)(local_470 + 0xc0104),"%100s",local_448);
            bVar8 = false;
            if (iVar3 != -1) {
              iVar4 = strcmp(local_448,"MeshVersionFormatted");
              bVar8 = iVar4 != 0;
            }
          } while (bVar8);
          if (iVar3 == -1) {
            longjmp((__jmp_buf_tag *)(local_470 + 0x12),-0xe);
          }
          iVar3 = __isoc99_fscanf(*(undefined8 *)(local_470 + 0xc0104),"%d",local_470 + 1);
          if (iVar3 != 1) {
            longjmp((__jmp_buf_tag *)(local_470 + 0x12),-1);
          }
          if (((int)local_470[1] < 1) || (4 < (int)local_470[1])) {
            longjmp((__jmp_buf_tag *)(local_470 + 0x12),-0xf);
          }
          do {
            iVar3 = __isoc99_fscanf(*(undefined8 *)(local_470 + 0xc0104),"%100s",local_448);
            bVar8 = false;
            if (iVar3 != -1) {
              iVar4 = strcmp(local_448,"Dimension");
              bVar8 = iVar4 != 0;
            }
          } while (bVar8);
          if (iVar3 == -1) {
            longjmp((__jmp_buf_tag *)(local_470 + 0x12),-0x10);
          }
          iVar3 = __isoc99_fscanf(*(undefined8 *)(local_470 + 0xc0104),"%d",local_470);
          if (iVar3 != 1) {
            longjmp((__jmp_buf_tag *)(local_470 + 0x12),-1);
          }
        }
        else {
          pFVar7 = fopen((char *)(local_470 + 0xc010c),"rb");
          *(FILE **)(local_470 + 0xc0104) = pFVar7;
          if (pFVar7 == (FILE *)0x0) {
            longjmp((__jmp_buf_tag *)(local_470 + 0x12),-8);
          }
          sVar5 = fread(local_470 + 4,4,1,*(FILE **)(local_470 + 0xc0104));
          if (sVar5 != 1) {
            longjmp((__jmp_buf_tag *)(local_470 + 0x12),-3);
          }
          if ((local_470[4] != 1) && (local_470[4] != 0x1000000)) {
            longjmp((__jmp_buf_tag *)(local_470 + 0x12),-9);
          }
          ScaWrd(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
          if (((int)local_470[1] < 1) || (4 < (int)local_470[1])) {
            longjmp((__jmp_buf_tag *)(local_470 + 0x12),-10);
          }
          ScaWrd(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
          if (local_18 != 3) {
            longjmp((__jmp_buf_tag *)(local_470 + 0x12),-0xc);
          }
          GetPos(in_stack_fffffffffffffa80);
          ScaWrd(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
        }
        if ((*local_470 != 2) && (*local_470 != 3)) {
          longjmp((__jmp_buf_tag *)(local_470 + 0x12),-0x11);
        }
        *puVar1 = local_470[1];
        *puVar2 = *local_470;
        if (local_470[1] == 1) {
          local_470[6] = 0x20;
        }
        else {
          local_470[6] = 0x40;
        }
        iVar3 = ScaKwdTab(in_stack_fffffffffffffea0);
        if (iVar3 == 0) {
          local_8 = (uint *)0x0;
        }
        else {
          local_470[8] = 1;
          local_470[9] = *local_470;
          local_470[10] = *local_470 * (*local_470 - 1);
          local_470[0xb] = *local_470 * *local_470;
        }
      }
      else if (local_470[2] == 2) {
        local_470[4] = 1;
        local_458 = local_528;
        local_468._8_8_ = &stack0x00000008;
        local_468._4_4_ = 0x30;
        local_470[1] = (uint)local_518;
        msh_00 = (GmfMshSct *)local_468;
        wrd = &local_510;
        local_468._0_4_ = 0x20;
        *local_470 = (uint)local_510;
        if (((int)local_470[1] < 1) || (4 < (int)local_470[1])) {
          longjmp((__jmp_buf_tag *)(local_470 + 0x12),-0x12);
        }
        if ((*local_470 != 2) && (*local_470 != 3)) {
          longjmp((__jmp_buf_tag *)(local_470 + 0x12),-0x14);
        }
        if (local_470[1] == 1) {
          local_470[6] = 0x20;
        }
        else {
          local_470[6] = 0x40;
        }
        if ((local_470[3] & 2) == 0) {
          pFVar7 = fopen((char *)(local_470 + 0xc010c),"wb");
          *(FILE **)(local_470 + 0xc0104) = pFVar7;
          if (pFVar7 == (FILE *)0x0) {
            longjmp((__jmp_buf_tag *)(local_470 + 0x12),-0x17);
          }
        }
        else {
          pFVar7 = fopen((char *)(local_470 + 0xc010c),"wb");
          *(FILE **)(local_470 + 0xc0104) = pFVar7;
          if (pFVar7 == (FILE *)0x0) {
            longjmp((__jmp_buf_tag *)(local_470 + 0x12),-0x16);
          }
        }
        if ((local_470[3] & 1) == 0) {
          RecWrd(msh_00,wrd);
          RecWrd(msh_00,wrd);
          GmfSetKwd((int64_t)local_8,3,0);
          RecWrd(msh_00,wrd);
        }
        else {
          fprintf(*(FILE **)(local_470 + 0xc0104),"%s %d\n\n",GmfKwdFmt[1][0],(ulong)local_470[1]);
          fprintf(*(FILE **)(local_470 + 0xc0104),"%s\n%d\n",GmfKwdFmt[3][0],(ulong)*local_470);
        }
        local_470[8] = 1;
        local_470[9] = *local_470;
        local_470[10] = *local_470 * (*local_470 - 1);
        local_470[0xb] = *local_470 * *local_470;
      }
      else {
        free(local_470);
        local_8 = (uint *)0x0;
      }
    }
    else {
      if (*(long *)(local_470 + 0xc0104) != 0) {
        fclose(*(FILE **)(local_470 + 0xc0104));
      }
      if (local_470[5] != 0) {
        close(local_470[5]);
      }
      free(local_470);
      local_8 = (uint *)0x0;
    }
  }
  return (int64_t)local_8;
}

Assistant:

int64_t GmfOpenMesh(const char *FilNam, int mod, ...)
{
   int      KwdCod, res, *PtrVer, *PtrDim, err;
   int64_t  MshIdx;
   char     str[ GmfStrSiz ];
   va_list  VarArg;
   GmfMshSct *msh;

   /*---------------------*/
   /* MESH STRUCTURE INIT */
   /*---------------------*/

   if(!(msh = calloc(1, sizeof(GmfMshSct))))
      return(0);

   MshIdx = (int64_t)msh;

   // Save the current stack environment for longjmp
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      if(msh->hdl != NULL)
         fclose(msh->hdl);

      if(msh->FilDes != 0)
#ifdef GMF_WINDOWS
         _close(msh->FilDes);
#else
         close(msh->FilDes);
#endif

      free(msh);
      return(0);
   }

   // Copy the FilNam into the structure
   if(strlen(FilNam) + 7 >= GmfStrSiz)
      longjmp(msh->err, -4);

   strcpy(msh->FilNam, FilNam);

   // Store the opening mod (read or write) and guess
   // the filetype (binary or ascii) depending on the extension
   msh->mod = mod;
   msh->buf = (void *)msh->DblBuf;
   msh->FltBuf = (void *)msh->DblBuf;
   msh->IntBuf = (void *)msh->DblBuf;

   if(strstr(msh->FilNam, ".meshb"))
      msh->typ |= (Bin | MshFil);
   else if(strstr(msh->FilNam, ".mesh"))
      msh->typ |= (Asc | MshFil);
   else if(strstr(msh->FilNam, ".solb"))
      msh->typ |= (Bin | SolFil);
   else if(strstr(msh->FilNam, ".sol"))
      msh->typ |= (Asc | SolFil);
   else
      longjmp(msh->err, -5);

   // Open the file in the required mod and initialize the mesh structure
   if(msh->mod == GmfRead)
   {

      /*-----------------------*/
      /* OPEN FILE FOR READING */
      /*-----------------------*/

      va_start(VarArg, mod);
      PtrVer = va_arg(VarArg, int *);
      PtrDim = va_arg(VarArg, int *);
      va_end(VarArg);

      // Read the endian coding tag, the mesh version
      // and the mesh dimension (mandatory kwd)
      if(msh->typ & Bin)
      {
         // Create the name string and open the file
#ifdef WITH_GMF_AIO
         // [Bruno] added binary flag (necessary under Windows)
         msh->FilDes = open(msh->FilNam, OPEN_READ_FLAGS, OPEN_READ_MODE);

         if(msh->FilDes <= 0)
            longjmp(msh->err, -6);

         // Read the endian coding tag
         if(read(msh->FilDes, &msh->cod, WrdSiz) != WrdSiz)
            longjmp(msh->err, -7);
#else
         // [Bruno] added binary flag (necessary under Windows)
         if(!(msh->hdl = fopen(msh->FilNam, "rb")))
            longjmp(msh->err, -8);

         // Read the endian coding tag
         safe_fread(&msh->cod, WrdSiz, 1, msh->hdl, msh->err);
#endif

         // Read the mesh version and the mesh dimension (mandatory kwd)
         if( (msh->cod != 1) && (msh->cod != 16777216) )
            longjmp(msh->err, -9);

         ScaWrd(msh, (unsigned char *)&msh->ver);

         if( (msh->ver < 1) || (msh->ver > 4) )
            longjmp(msh->err, -10);

         if( (msh->ver >= 3) && (sizeof(int64_t) != 8) )
            longjmp(msh->err, -11);

         ScaWrd(msh, (unsigned char *)&KwdCod);

         if(KwdCod != GmfDimension)
            longjmp(msh->err, -12);

         GetPos(msh);
         ScaWrd(msh, (unsigned char *)&msh->dim);
      }
      else
      {
         // Create the name string and open the file
         if(!(msh->hdl = fopen(msh->FilNam, "rb")))
            longjmp(msh->err, -13);

         do
         {
            res = fscanf(msh->hdl, "%100s", str);
         }while( (res != EOF) && strcmp(str, "MeshVersionFormatted") );

         if(res == EOF)
            longjmp(msh->err, -14);

         safe_fscanf(msh->hdl, "%d", &msh->ver, msh->err);

         if( (msh->ver < 1) || (msh->ver > 4) )
            longjmp(msh->err, -15);

         do
         {
            res = fscanf(msh->hdl, "%100s", str);
         }while( (res != EOF) && strcmp(str, "Dimension") );

         if(res == EOF)
            longjmp(msh->err, -16);

         safe_fscanf(msh->hdl, "%d", &msh->dim, msh->err);
      }

      if( (msh->dim != 2) && (msh->dim != 3) )
         longjmp(msh->err, -17);

      (*PtrVer) = msh->ver;
      (*PtrDim) = msh->dim;

      // Set default real numbers size
      if(msh->ver == 1)
         msh->FltSiz = 32;
      else
         msh->FltSiz = 64;

      /*------------*/
      /* KW READING */
      /*------------*/

      // Read the list of kw present in the file
      if(!ScaKwdTab(msh))
         return(0);

      // Preset solution entities sizes
      msh->SolTypSiz[ GmfSca    ] = 1;
      msh->SolTypSiz[ GmfVec    ] = msh->dim;
      msh->SolTypSiz[ GmfSymMat ] = msh->dim * (msh->dim - 1);
      msh->SolTypSiz[ GmfMat    ] = msh->dim * msh->dim;

      return(MshIdx);
   }
   else if(msh->mod == GmfWrite)
   {

      /*-----------------------*/
      /* OPEN FILE FOR WRITING */
      /*-----------------------*/

      msh->cod = 1;

      // Check if the user provided a valid version number and dimension
      va_start(VarArg, mod);
      msh->ver = va_arg(VarArg, int);
      msh->dim = va_arg(VarArg, int);
      va_end(VarArg);

      if( (msh->ver < 1) || (msh->ver > 4) )
         longjmp(msh->err, -18);

      if( (msh->ver >= 3) && (sizeof(int64_t) != 8) )
         longjmp(msh->err, -19);

      if( (msh->dim != 2) && (msh->dim != 3) )
         longjmp(msh->err, -20);

      // Set default real numbers size
      if(msh->ver == 1)
         msh->FltSiz = 32;
      else
         msh->FltSiz = 64;

      // Create the mesh file
      if(msh->typ & Bin) 
      {
         /* 
          * [Bruno] replaced previous call to creat():
          * with a call to open(), because Windows needs the
          * binary flag to be specified.
          */
#ifdef WITH_GMF_AIO
         msh->FilDes = open(msh->FilNam, OPEN_WRITE_FLAGS, OPEN_WRITE_MODE);

         if(msh->FilDes <= 0)
            longjmp(msh->err, -21);
#else
         if(!(msh->hdl = fopen(msh->FilNam, "wb")))
            longjmp(msh->err, -22);
#endif
      }
      else if(!(msh->hdl = fopen(msh->FilNam, "wb")))
         longjmp(msh->err, -23);


      /*------------*/
      /* KW WRITING */
      /*------------*/

      // Write the mesh version and dimension
      if(msh->typ & Asc)
      {
         fprintf(msh->hdl, "%s %d\n\n",
               GmfKwdFmt[ GmfVersionFormatted ][0], msh->ver);
         fprintf(msh->hdl, "%s\n%d\n",
               GmfKwdFmt[ GmfDimension ][0], msh->dim);
      }
      else
      {
         RecWrd(msh, (unsigned char *)&msh->cod);
         RecWrd(msh, (unsigned char *)&msh->ver);
         GmfSetKwd(MshIdx, GmfDimension, 0);
         RecWrd(msh, (unsigned char *)&msh->dim);
      }

      // Preset solution entities sizes
      msh->SolTypSiz[ GmfSca    ] = 1;
      msh->SolTypSiz[ GmfVec    ] = msh->dim;
      msh->SolTypSiz[ GmfSymMat ] = msh->dim * (msh->dim - 1);
      msh->SolTypSiz[ GmfMat    ] = msh->dim * msh->dim;

      return(MshIdx);
   }
   else
   {
      free(msh);
      return(0);
   }
}